

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_definition.c
# Opt level: O1

bool_t prf_instance_definition_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  int16_t *piVar1;
  uint16_t uVar2;
  int16_t iVar3;
  uint8_t *puVar4;
  bool_t bVar5;
  uint n_bytes;
  
  uVar2 = bf_get_uint16_be(bfile);
  node->opcode = uVar2;
  if (uVar2 == prf_instance_definition_info.opcode) {
    uVar2 = bf_get_uint16_be(bfile);
    node->length = uVar2;
    if (4 < uVar2 && node->data == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar4 = (uint8_t *)malloc((ulong)(uVar2 - 4));
      }
      else {
        puVar4 = (uint8_t *)pool_malloc(pool_id,uVar2 - 4);
      }
      node->data = puVar4;
      if (puVar4 == (uint8_t *)0x0) {
        prf_error(9,"memory allocation problem (returned NULL)");
        n_bytes = 4;
        goto LAB_0010735a;
      }
    }
    piVar1 = (int16_t *)node->data;
    iVar3 = bf_get_int16_be(bfile);
    *piVar1 = iVar3;
    iVar3 = bf_get_int16_be(bfile);
    piVar1[1] = iVar3;
    bVar5 = 1;
    if (8 < node->length) {
      bf_read(bfile,node->data + 4,node->length - 8);
    }
  }
  else {
    prf_error(9,"tried instance definition load method for node of type %d.",(ulong)uVar2);
    n_bytes = 2;
LAB_0010735a:
    bVar5 = 0;
    bf_rewind(bfile,n_bytes);
  }
  return bVar5;
}

Assistant:

static bool_t
prf_instance_definition_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    node_data * data;
    uint32_t pos = 4;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_instance_definition_info.opcode ) {
        prf_error( 9, "tried instance definition load method for "
                   "node of type %d.", node->opcode );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );
    assert(node->length >= 8);

    if ( node->data == NULL && node->length > 4 ) {
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *) malloc( node->length - 4);
        else
            node->data = (uint8_t *) pool_malloc( state->model->mempool_id,
                                                  node->length - 4 );
        if ( node->data == NULL ) {
            prf_error( 9, "memory allocation problem (returned NULL)" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }


    data = (node_data *) node->data;
    data->spare = bf_get_int16_be( bfile ); pos += 2;
    data->instance_definition_number = bf_get_int16_be( bfile ); pos += 2;

    if ( pos < node->length ) /* padding */
        pos += bf_read( bfile, node->data + pos - 4, node->length - pos );
    return TRUE;
}